

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

void __thiscall ON_OBSOLETE_V5_DimLinear::ON_OBSOLETE_V5_DimLinear(ON_OBSOLETE_V5_DimLinear *this)

{
  int iVar1;
  ON_2dPoint *__s;
  ON_AnnotationTextFormula *pOVar2;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Plane *pOVar5;
  byte bVar6;
  
  bVar6 = 0;
  ON_OBSOLETE_V5_Annotation::ON_OBSOLETE_V5_Annotation(&this->super_ON_OBSOLETE_V5_Annotation);
  (this->super_ON_OBSOLETE_V5_Annotation).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0081fb10;
  (this->super_ON_OBSOLETE_V5_Annotation).m_type = dtDimLinear;
  (this->super_ON_OBSOLETE_V5_Annotation).m_textdisplaymode = kAboveLine;
  pOVar4 = &ON_xy_plane;
  pOVar5 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar5->origin).x = (pOVar4->origin).x;
    pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  ON_wString::operator=(&(this->super_ON_OBSOLETE_V5_Annotation).m_usertext.super_ON_wString,L"<>");
  (this->super_ON_OBSOLETE_V5_Annotation).m_usertext.m_rect.left = 0;
  (this->super_ON_OBSOLETE_V5_Annotation).m_usertext.m_rect.top = 0;
  (this->super_ON_OBSOLETE_V5_Annotation).m_usertext.m_rect.right = 0;
  (this->super_ON_OBSOLETE_V5_Annotation).m_usertext.m_rect.bottom = 0;
  pOVar2 = ON_AnnotationTextFormula::Get(&this->super_ON_OBSOLETE_V5_Annotation);
  if (pOVar2 != (ON_AnnotationTextFormula *)0x0) {
    (*(pOVar2->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar2);
  }
  if ((uint)(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
            m_capacity < 5) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity
              (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,5)
    ;
  }
  iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
          m_capacity;
  if (4 < (long)iVar1) {
    (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count = 5;
  }
  __s = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
  if (0 < iVar1 && __s != (ON_2dPoint *)0x0) {
    memset(__s,0,(long)iVar1 << 4);
    return;
  }
  return;
}

Assistant:

ON_OBSOLETE_V5_DimLinear::ON_OBSOLETE_V5_DimLinear()
{
  //ON_OBSOLETE_V5_DimExtra* pDE = new ON_OBSOLETE_V5_DimExtra;
  //if( pDE)
  //{
  //  if( !AttachUserData( pDE))
  //    delete pDE;
  //  else
  //    pDE->SetDefaults();
  //}

  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear;
  m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
  m_plane = ON_xy_plane;
  SetTextValue(DefaultText());
  SetTextFormula(0);
  m_points.Reserve(ON_OBSOLETE_V5_DimLinear::dim_pt_count);
  m_points.SetCount(ON_OBSOLETE_V5_DimLinear::dim_pt_count);
  m_points.Zero();
}